

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

SUNErrCode SUNLinSolFree_SPGMR(SUNLinearSolver S)

{
  long *in_RDI;
  int k;
  int local_c;
  
  if (*in_RDI != 0) {
    if (*(long *)(*in_RDI + 0x78) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x78));
      *(undefined8 *)(*in_RDI + 0x78) = 0;
    }
    if (*(long *)(*in_RDI + 0x88) != 0) {
      N_VDestroy(*(undefined8 *)(*in_RDI + 0x88));
      *(undefined8 *)(*in_RDI + 0x88) = 0;
    }
    if (*(long *)(*in_RDI + 0x60) != 0) {
      N_VDestroyVectorArray(*(undefined8 *)(*in_RDI + 0x60),*(int *)*in_RDI + 1);
      *(undefined8 *)(*in_RDI + 0x60) = 0;
    }
    if (*(long *)(*in_RDI + 0x68) != 0) {
      for (local_c = 0; local_c <= *(int *)*in_RDI; local_c = local_c + 1) {
        if (*(long *)(*(long *)(*in_RDI + 0x68) + (long)local_c * 8) != 0) {
          free(*(void **)(*(long *)(*in_RDI + 0x68) + (long)local_c * 8));
          *(undefined8 *)(*(long *)(*in_RDI + 0x68) + (long)local_c * 8) = 0;
        }
      }
      free(*(void **)(*in_RDI + 0x68));
      *(undefined8 *)(*in_RDI + 0x68) = 0;
    }
    if (*(long *)(*in_RDI + 0x70) != 0) {
      free(*(void **)(*in_RDI + 0x70));
      *(undefined8 *)(*in_RDI + 0x70) = 0;
    }
    if (*(long *)(*in_RDI + 0x80) != 0) {
      free(*(void **)(*in_RDI + 0x80));
      *(undefined8 *)(*in_RDI + 0x80) = 0;
    }
    if (*(long *)(*in_RDI + 0x90) != 0) {
      free(*(void **)(*in_RDI + 0x90));
      *(undefined8 *)(*in_RDI + 0x90) = 0;
    }
    if (*(long *)(*in_RDI + 0x98) != 0) {
      free(*(void **)(*in_RDI + 0x98));
      *(undefined8 *)(*in_RDI + 0x98) = 0;
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  if (in_RDI[1] != 0) {
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
  }
  free(in_RDI);
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_SPGMR(SUNLinearSolver S)
{
  int k;

  if (S->content)
  {
    /* delete items from within the content structure */
    if (SPGMR_CONTENT(S)->xcor)
    {
      N_VDestroy(SPGMR_CONTENT(S)->xcor);
      SPGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPGMR_CONTENT(S)->vtemp)
    {
      N_VDestroy(SPGMR_CONTENT(S)->vtemp);
      SPGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPGMR_CONTENT(S)->V)
    {
      N_VDestroyVectorArray(SPGMR_CONTENT(S)->V, SPGMR_CONTENT(S)->maxl + 1);
      SPGMR_CONTENT(S)->V = NULL;
    }
    if (SPGMR_CONTENT(S)->Hes)
    {
      for (k = 0; k <= SPGMR_CONTENT(S)->maxl; k++)
      {
        if (SPGMR_CONTENT(S)->Hes[k])
        {
          free(SPGMR_CONTENT(S)->Hes[k]);
          SPGMR_CONTENT(S)->Hes[k] = NULL;
        }
      }
      free(SPGMR_CONTENT(S)->Hes);
      SPGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPGMR_CONTENT(S)->givens)
    {
      free(SPGMR_CONTENT(S)->givens);
      SPGMR_CONTENT(S)->givens = NULL;
    }
    if (SPGMR_CONTENT(S)->yg)
    {
      free(SPGMR_CONTENT(S)->yg);
      SPGMR_CONTENT(S)->yg = NULL;
    }
    if (SPGMR_CONTENT(S)->cv)
    {
      free(SPGMR_CONTENT(S)->cv);
      SPGMR_CONTENT(S)->cv = NULL;
    }
    if (SPGMR_CONTENT(S)->Xv)
    {
      free(SPGMR_CONTENT(S)->Xv);
      SPGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}